

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O1

FL_BLINE * __thiscall Fl_Browser::find_line(Fl_Browser *this,int line)

{
  int iVar1;
  long lVar2;
  FL_BLINE *pFVar3;
  int iVar4;
  
  iVar4 = this->cacheline;
  if (iVar4 == line) {
    return this->cache;
  }
  if (((iVar4 == 0) || (line <= iVar4 / 2)) || (lVar2 = 0x278, (this->lines + iVar4) / 2 <= line)) {
    iVar1 = this->lines / 2;
    lVar2 = (ulong)(iVar1 < line) * 8 + 0x268;
    iVar4 = 1;
    if (iVar1 < line) {
      iVar4 = this->lines;
    }
  }
  pFVar3 = *(FL_BLINE **)
            ((long)&(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget + lVar2
            );
  if (pFVar3 != (FL_BLINE *)0x0 && iVar4 < line) {
    do {
      iVar4 = iVar4 + 1;
      pFVar3 = pFVar3->next;
      if (line <= iVar4) break;
    } while (pFVar3 != (FL_BLINE *)0x0);
  }
  for (; (line < iVar4 && (pFVar3 != (FL_BLINE *)0x0)); pFVar3 = pFVar3->prev) {
    iVar4 = iVar4 + -1;
  }
  this->cacheline = line;
  this->cache = pFVar3;
  return pFVar3;
}

Assistant:

FL_BLINE* Fl_Browser::find_line(int line) const {
  int n; FL_BLINE* l;
  if (line == cacheline) return cache;
  if (cacheline && line > (cacheline/2) && line < ((cacheline+lines)/2)) {
    n = cacheline; l = cache;
  } else if (line <= (lines/2)) {
    n = 1; l = first;
  } else {
    n = lines; l = last;
  }
  for (; n < line && l; n++) l = l->next;
  for (; n > line && l; n--) l = l->prev;
  ((Fl_Browser*)this)->cacheline = line;
  ((Fl_Browser*)this)->cache = l;
  return l;
}